

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_get_txid(wally_tx *tx,uchar *bytes_out,size_t len)

{
  int iVar1;
  size_t local_38;
  size_t is_elements;
  size_t sStack_28;
  uint32_t flags;
  size_t len_local;
  uchar *bytes_out_local;
  wally_tx *tx_local;
  
  is_elements._4_4_ = 4;
  local_38 = 0;
  sStack_28 = len;
  len_local = (size_t)bytes_out;
  bytes_out_local = (uchar *)tx;
  iVar1 = wally_tx_is_elements(tx,&local_38);
  if (iVar1 == 0) {
    if (local_38 == 0) {
      is_elements._4_4_ = is_elements._4_4_ | 8;
    }
    tx_local._4_4_ =
         tx_to_hex_or_txid((wally_tx *)bytes_out_local,is_elements._4_4_,(char **)0x0,
                           (uchar *)len_local,sStack_28,local_38 != 0);
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_get_txid(const struct wally_tx *tx, unsigned char *bytes_out, size_t len)
{
    uint32_t flags = WALLY_TX_FLAG_ALLOW_PARTIAL;
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    if (!is_elements)
        flags |= WALLY_TX_FLAG_PRE_BIP144;
    return tx_to_hex_or_txid(tx, flags, NULL, bytes_out, len, is_elements);
}